

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O1

void __thiscall
ImDrawList::AddBezierQuadratic
          (ImDrawList *this,ImVec2 *p1,ImVec2 *p2,ImVec2 *p3,ImU32 col,float thickness,
          int num_segments)

{
  int iVar1;
  ImVec2 *__src;
  ImVec2 *__dest;
  int iVar2;
  int iVar3;
  
  if (0xffffff < col) {
    iVar3 = (this->_Path).Size;
    iVar1 = (this->_Path).Capacity;
    if (iVar3 == iVar1) {
      iVar3 = iVar3 + 1;
      if (iVar1 == 0) {
        iVar2 = 8;
      }
      else {
        iVar2 = iVar1 / 2 + iVar1;
      }
      if (iVar3 < iVar2) {
        iVar3 = iVar2;
      }
      if (iVar1 < iVar3) {
        __dest = (ImVec2 *)ImGui::MemAlloc((long)iVar3 << 3);
        __src = (this->_Path).Data;
        if (__src != (ImVec2 *)0x0) {
          memcpy(__dest,__src,(long)(this->_Path).Size << 3);
          ImGui::MemFree((this->_Path).Data);
        }
        (this->_Path).Data = __dest;
        (this->_Path).Capacity = iVar3;
      }
    }
    (this->_Path).Data[(this->_Path).Size] = *p1;
    (this->_Path).Size = (this->_Path).Size + 1;
    PathBezierQuadraticCurveTo(this,p2,p3,num_segments);
    AddPolyline(this,(this->_Path).Data,(this->_Path).Size,col,0,thickness);
    (this->_Path).Size = 0;
  }
  return;
}

Assistant:

void ImDrawList::AddBezierQuadratic(const ImVec2& p1, const ImVec2& p2, const ImVec2& p3, ImU32 col, float thickness, int num_segments)
{
    if ((col & IM_COL32_A_MASK) == 0)
        return;

    PathLineTo(p1);
    PathBezierQuadraticCurveTo(p2, p3, num_segments);
    PathStroke(col, 0, thickness);
}